

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_expression.cpp
# Opt level: O2

void __thiscall duckdb::Expression::Serialize(Expression *this,Serializer *serializer)

{
  optional_idx local_18;
  
  Serializer::WriteProperty<duckdb::ExpressionClass>
            (serializer,100,"expression_class",&(this->super_BaseExpression).expression_class);
  Serializer::WriteProperty<duckdb::ExpressionType>
            (serializer,0x65,"type",&(this->super_BaseExpression).type);
  Serializer::WritePropertyWithDefault<std::__cxx11::string>
            (serializer,0x66,"alias",&(this->super_BaseExpression).alias);
  local_18.index = 0xffffffffffffffff;
  Serializer::WritePropertyWithDefault<duckdb::optional_idx>
            (serializer,0x67,"query_location",&(this->super_BaseExpression).query_location,&local_18
            );
  return;
}

Assistant:

void Expression::Serialize(Serializer &serializer) const {
	serializer.WriteProperty<ExpressionClass>(100, "expression_class", expression_class);
	serializer.WriteProperty<ExpressionType>(101, "type", type);
	serializer.WritePropertyWithDefault<string>(102, "alias", alias);
	serializer.WritePropertyWithDefault<optional_idx>(103, "query_location", query_location, optional_idx());
}